

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

void __thiscall
poplar::
map<poplar::compact_bonsai_trie<80U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
::map(map<poplar::compact_bonsai_trie<80U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
      *this,uint32_t capa_bits,uint64_t lambda)

{
  int iVar1;
  bool bVar2;
  value_type_conflict4 vVar3;
  undefined8 uVar4;
  reference pvVar5;
  pointer in_RDX;
  compact_bonsai_nlm<int,_16UL> *in_RDI;
  undefined7 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdef;
  compact_bonsai_trie<80U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *in_stack_fffffffffffffdf0;
  compact_bonsai_nlm<int,_16UL> *this_00;
  value_type_conflict4 *__u;
  pointer *this_01;
  uint32_t capa_bits_00;
  compact_bonsai_nlm<int,_16UL> local_1c0;
  value_type_conflict4 local_180 [196];
  uint32_t in_stack_ffffffffffffff44;
  uint32_t in_stack_ffffffffffffff48;
  uint32_t in_stack_ffffffffffffff4c;
  compact_bonsai_trie<80U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *in_stack_ffffffffffffff50;
  
  *(undefined1 *)
   &(in_RDI->ptrs_).
    super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
  (in_RDI->ptrs_).
  super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x20;
  compact_bonsai_trie<80U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  ::compact_bonsai_trie(in_stack_fffffffffffffdf0);
  capa_bits_00 = (uint32_t)((ulong)&in_RDI[5].chunks_ >> 0x20);
  compact_bonsai_nlm<int,_16UL>::compact_bonsai_nlm
            ((compact_bonsai_nlm<int,_16UL> *)in_stack_fffffffffffffdf0);
  memset(&in_RDI[6].chunks_,0,0x100);
  *(undefined4 *)
   &in_RDI[10].chunks_.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start = 0;
  in_RDI[10].chunks_.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar2 = is_power2((uint64_t)in_RDX);
  if (!bVar2) {
    uVar4 = __cxa_allocate_exception(0x10);
    exception::exception
              ((exception *)in_stack_fffffffffffffdf0,
               (char *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
    __cxa_throw(uVar4,&exception::typeinfo,exception::~exception);
  }
  *(undefined1 *)
   &(in_RDI->ptrs_).
    super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 1;
  (in_RDI->ptrs_).
  super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = in_RDX;
  bit_tools::ceil_log2((uint64_t)in_stack_fffffffffffffdf0);
  compact_bonsai_trie<80U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  ::compact_bonsai_trie
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,
             in_stack_ffffffffffffff44);
  this_01 = &(in_RDI->ptrs_).
             super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __u = local_180;
  compact_bonsai_trie<80U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  ::operator=(in_stack_fffffffffffffdf0,
              (compact_bonsai_trie<80U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
               *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
  compact_bonsai_trie<80U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  ::~compact_bonsai_trie(in_stack_fffffffffffffdf0);
  compact_bonsai_trie<80U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  ::capa_bits((compact_bonsai_trie<80U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
               *)0x1df003);
  compact_bonsai_nlm<int,_16UL>::compact_bonsai_nlm(in_RDI,capa_bits_00);
  this_00 = &local_1c0;
  compact_bonsai_nlm<int,_16UL>::operator=
            (this_00,(compact_bonsai_nlm<int,_16UL> *)
                     CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
  compact_bonsai_nlm<int,_16UL>::~compact_bonsai_nlm(this_00);
  std::array<unsigned_char,_256UL>::fill((array<unsigned_char,_256UL> *)this_01,__u);
  iVar1 = *(int *)&in_RDI[10].chunks_.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_start;
  *(int *)&in_RDI[10].chunks_.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start = iVar1 + 1;
  vVar3 = (value_type_conflict4)iVar1;
  pvVar5 = std::array<unsigned_char,_256UL>::operator[]
                     ((array<unsigned_char,_256UL> *)this_00,
                      CONCAT17(vVar3,in_stack_fffffffffffffde8));
  *pvVar5 = vVar3;
  return;
}

Assistant:

explicit map(uint32_t capa_bits, uint64_t lambda = 32) {
        POPLAR_THROW_IF(!is_power2(lambda), "lambda must be a power of 2.");

        is_ready_ = true;
        lambda_ = lambda;
        hash_trie_ = Trie{capa_bits, 8 + bit_tools::ceil_log2(lambda_)};
        label_store_ = NLM{hash_trie_.capa_bits()};
        codes_.fill(UINT8_MAX);
        codes_[0] = static_cast<uint8_t>(num_codes_++);  // terminator
    }